

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Bool prvTidyCheckNodeIntegrity(Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  
  pNVar1 = node->prev;
  if ((pNVar1 == (Node *)0x0) || (pNVar1->next == node)) {
    pNVar2 = node->next;
    if (pNVar2 != (Node *)0x0) {
      if (pNVar2 == node) {
        return no;
      }
      if (pNVar2->prev != node) {
        return no;
      }
    }
    pNVar3 = node->parent;
    if ((pNVar3 == (Node *)0x0) ||
       (((pNVar1 != (Node *)0x0 || (pNVar3->content == node)) &&
        ((pNVar2 != (Node *)0x0 || (pNVar3->last == node)))))) {
      pNVar1 = node->content;
      while( true ) {
        if (pNVar1 == (Node *)0x0) {
          return yes;
        }
        if (pNVar1->parent != node) break;
        BVar4 = prvTidyCheckNodeIntegrity(pNVar1);
        if (BVar4 == no) {
          return no;
        }
        pNVar1 = pNVar1->next;
      }
      return no;
    }
  }
  return no;
}

Assistant:

Bool TY_(CheckNodeIntegrity)(Node *node)
{
#ifndef NO_NODE_INTEGRITY_CHECK
    Node *child;

    if (node->prev)
    {
        if (node->prev->next != node)
            return no;
    }

    if (node->next)
    {
        if (node->next == node || node->next->prev != node)
            return no;
    }

    if (node->parent)
    {
        if (node->prev == NULL && node->parent->content != node)
            return no;

        if (node->next == NULL && node->parent->last != node)
            return no;
    }

    for (child = node->content; child; child = child->next)
        if ( child->parent != node || !TY_(CheckNodeIntegrity)(child) )
            return no;

#endif
    return yes;
}